

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classify-symbols.cc
# Opt level: O1

void __thiscall ClassifySymbols::operator()(ClassifySymbols *this,Grammar *grammar)

{
  _Rb_tree_node_base *__k;
  iterator iVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  args;
  undefined8 local_48;
  _Base_ptr p_Stack_40;
  
  (*(this->super_Visitor)._vptr_Visitor[2])();
  p_Var3 = (grammar->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(grammar->names)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      __k = p_Var3 + 1;
      iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(grammar->non_terminals)._M_t,(key_type *)__k);
      if ((_Rb_tree_header *)iVar1._M_node ==
          &(grammar->non_terminals)._M_t._M_impl.super__Rb_tree_header) {
        iVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&(grammar->externals)._M_t,(key_type *)__k);
        if ((_Rb_tree_header *)iVar2._M_node ==
            &(grammar->externals)._M_t._M_impl.super__Rb_tree_header) {
          iVar1 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&(grammar->terminals)._M_t,(key_type *)__k);
          if ((_Rb_tree_header *)iVar1._M_node ==
              &(grammar->terminals)._M_t._M_impl.super__Rb_tree_header) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&grammar->undef,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          }
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  p_Var3 = (grammar->undef)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(grammar->undef)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      local_48 = *(undefined8 *)(p_Var3 + 1);
      p_Stack_40 = p_Var3[1]._M_parent;
      format_str.size_ = 0x15;
      format_str.data_ = "undefined symbol \'{}\'";
      args.field_1.values_ =
           (value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
            *)&local_48;
      args.desc_ = 0xd;
      fmt::v7::vprint<char>
                ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,format_str,args);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

void ClassifySymbols::operator()(ast::Grammar* grammar) {
  grammar->accept(this);

  for (auto&& n : grammar->names) {
    if (grammar->non_terminals.find(n) != grammar->non_terminals.end())
      continue;

    if (grammar->externals.find(n) != grammar->externals.end()) continue;

    if (grammar->terminals.find(n) != grammar->terminals.end()) continue;

    grammar->undef.insert(n);
  }

  for (auto&& u : grammar->undef) {
    fmt::print(std::cerr, "undefined symbol '{}'", u);
    std::cerr << std::endl;
  }
}